

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitJumpCleanup(ByteCodeGenerator *this,ParseNode *target,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JumpCleanupInfo *pJVar4;
  FunctionBody *functionBody;
  uint uVar5;
  JumpCleanupList *pJVar6;
  undefined1 local_40 [8];
  Iterator iter;
  
  pJVar6 = this->jumpCleanupList;
  local_40 = (undefined1  [8])pJVar6;
  iter.list = &pJVar6->super_DListBase<JumpCleanupInfo,_RealCount>;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    while( true ) {
      if (pJVar6 == (JumpCleanupList *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar2) goto LAB_0076e516;
        *puVar3 = 0;
        pJVar6 = (JumpCleanupList *)iter.list;
      }
      iter.list = (pJVar6->super_DListBase<JumpCleanupInfo,_RealCount>).
                  super_DListNodeBase<JumpCleanupInfo>.next.list;
      if ((undefined1  [8])iter.list == local_40) {
        return;
      }
      pJVar4 = DListBase<JumpCleanupInfo,_RealCount>::Iterator::Data((Iterator *)local_40);
      if (pJVar4->loopNode == (ParseNode *)0x0) break;
      if (pJVar4->loopNode == target) {
        return;
      }
      functionBody = FuncInfo::GetParsedFunctionBody(funcInfo);
      bVar2 = Js::DynamicProfileInfo::EnableImplicitCallFlags(functionBody);
      pJVar6 = (JumpCleanupList *)iter.list;
      if (bVar2) {
        Js::ByteCodeWriter::Unsigned1(&this->m_writer,ProfiledLoopEnd,pJVar4->loopId);
        pJVar6 = (JumpCleanupList *)iter.list;
      }
    }
    uVar5 = pJVar4->tryOp - 0x16f;
    if (((3 < uVar5) || (uVar5 == 1)) && (1 < pJVar4->tryOp - 0xe7)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x2759,
                         "(info.tryOp == Js::OpCode::TryCatch || info.tryOp == Js::OpCode::TryFinally || info.tryOp == Js::OpCode::TryFinallyWithYield || info.tryOp == Js::OpCode::ResumeCatch || info.tryOp == Js::OpCode::ResumeFinally)"
                         ,
                         "info.tryOp == Js::OpCode::TryCatch || info.tryOp == Js::OpCode::TryFinally || info.tryOp == Js::OpCode::TryFinallyWithYield || info.tryOp == Js::OpCode::ResumeCatch || info.tryOp == Js::OpCode::ResumeFinally"
                        );
      if (!bVar2) {
LAB_0076e516:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    Js::ByteCodeWriter::Empty(&this->m_writer,Leave);
    pJVar6 = (JumpCleanupList *)iter.list;
  } while( true );
}

Assistant:

void ByteCodeGenerator::EmitJumpCleanup(ParseNode* target, FuncInfo* funcInfo)
{
    for (JumpCleanupList::Iterator iter(this->jumpCleanupList); iter.Next();)
    {
        const JumpCleanupInfo& info = iter.Data();

        if (info.loopNode)
        {
            if (info.loopNode == target)
                break;

#if ENABLE_PROFILE_INFO
            if (Js::DynamicProfileInfo::EnableImplicitCallFlags(funcInfo->GetParsedFunctionBody()))
                this->Writer()->Unsigned1(Js::OpCode::ProfiledLoopEnd, info.loopId);
#endif
        }
        else
        {
            Assert(
                info.tryOp == Js::OpCode::TryCatch ||
                info.tryOp == Js::OpCode::TryFinally ||
                info.tryOp == Js::OpCode::TryFinallyWithYield ||
                info.tryOp == Js::OpCode::ResumeCatch ||
                info.tryOp == Js::OpCode::ResumeFinally);

            // We insert OpCode::Leave when there is a 'return' inside try/catch/finally.
            // This is for flow control and does not participate in identifying boundaries 
            // of try/catch blocks, thus we shouldn't call RecordCrossFrameEntryExitRecord
            // here.
            this->Writer()->Empty(Js::OpCode::Leave);
        }
    }
}